

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equationofstateCmd.cpp
# Opt level: O0

void clear_args(gengetopt_args_info *args_info)

{
  gengetopt_args_info *args_info_local;
  
  args_info->input_arg = (char *)0x0;
  args_info->input_orig = (char *)0x0;
  args_info->output_arg = (char *)0x0;
  args_info->output_orig = (char *)0x0;
  args_info->start_arg = 0.8;
  args_info->start_orig = (char *)0x0;
  args_info->end_arg = 1.2;
  args_info->end_orig = (char *)0x0;
  args_info->number_arg = 0x32;
  args_info->number_orig = (char *)0x0;
  return;
}

Assistant:

static
void clear_args (struct gengetopt_args_info *args_info)
{
  FIX_UNUSED (args_info);
  args_info->input_arg = NULL;
  args_info->input_orig = NULL;
  args_info->output_arg = NULL;
  args_info->output_orig = NULL;
  args_info->start_arg = 0.8;
  args_info->start_orig = NULL;
  args_info->end_arg = 1.2;
  args_info->end_orig = NULL;
  args_info->number_arg = 50;
  args_info->number_orig = NULL;
  
}